

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O1

void __thiscall ipx::Model::EquilibrateMatrix(Model *this)

{
  double dVar1;
  int iVar2;
  int iVar3;
  pointer piVar4;
  pointer piVar5;
  pointer piVar6;
  pointer pdVar7;
  size_t sVar8;
  double *pdVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  uint uVar12;
  uint uVar13;
  double *pdVar14;
  size_t sVar16;
  void *__s;
  void *__s_00;
  long lVar17;
  int exp_00;
  int exp_01;
  long lVar18;
  ulong uVar19;
  bool bVar20;
  Int j;
  ulong uVar21;
  bool bVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  int exp_2;
  int exp_1;
  int exp;
  int local_5c;
  int local_58;
  uint local_54;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  ulong uVar15;
  
  iVar2 = (this->A_).nrow_;
  piVar4 = (this->A_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar5 = (this->A_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar6 = (this->A_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar7 = (this->A_).values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->colscale_)._M_size != 0) {
    operator_delete((this->colscale_)._M_data);
    (this->colscale_)._M_size = 0;
    pdVar14 = (double *)operator_new(0);
    (this->colscale_)._M_data = pdVar14;
  }
  uVar12 = (int)((ulong)((long)piVar5 - (long)piVar4) >> 2) - 1;
  uVar15 = (ulong)uVar12;
  if ((this->rowscale_)._M_size != 0) {
    operator_delete((this->rowscale_)._M_data);
    (this->rowscale_)._M_size = 0;
    pdVar14 = (double *)operator_new(0);
    (this->rowscale_)._M_data = pdVar14;
  }
  sVar16 = (size_t)(int)uVar12;
  iVar3 = piVar4[sVar16];
  if (0 < (long)iVar3) {
    bVar20 = false;
    lVar18 = 0;
    local_50 = (long)iVar2;
    do {
      frexp((double)((ulong)pdVar7[lVar18] & (ulong)DAT_003c6420),(int *)&local_54);
      uVar21 = local_50;
      if (3 < local_54) {
        bVar20 = true;
        break;
      }
      bVar22 = (long)iVar3 + -1 != lVar18;
      lVar18 = lVar18 + 1;
    } while (bVar22);
    if (bVar20) {
      if ((this->colscale_)._M_size != sVar16) {
        operator_delete((this->colscale_)._M_data);
        (this->colscale_)._M_size = sVar16;
        pdVar14 = (double *)operator_new(sVar16 * 8);
        (this->colscale_)._M_data = pdVar14;
      }
      if (uVar12 != 0) {
        memset((this->colscale_)._M_data,0,sVar16 * 8);
      }
      if ((this->rowscale_)._M_size != uVar21) {
        operator_delete((this->rowscale_)._M_data);
        (this->rowscale_)._M_size = uVar21;
        pdVar14 = (double *)operator_new(uVar21 * 8);
        (this->rowscale_)._M_data = pdVar14;
      }
      pdVar14 = (this->rowscale_)._M_data;
      if ((int)uVar21 != 0) {
        memset(pdVar14,0,uVar21 * 8);
      }
      auVar11 = _DAT_003c57d0;
      auVar10 = _DAT_003c57c0;
      sVar8 = (this->colscale_)._M_size;
      if (sVar8 != 0) {
        pdVar9 = (this->colscale_)._M_data;
        lVar18 = sVar8 - 1;
        auVar24._8_4_ = (int)lVar18;
        auVar24._0_8_ = lVar18;
        auVar24._12_4_ = (int)((ulong)lVar18 >> 0x20);
        uVar19 = 0;
        auVar24 = auVar24 ^ _DAT_003c57d0;
        do {
          auVar27._8_4_ = (int)uVar19;
          auVar27._0_8_ = uVar19;
          auVar27._12_4_ = (int)(uVar19 >> 0x20);
          auVar27 = (auVar27 | auVar10) ^ auVar11;
          if ((bool)(~(auVar27._4_4_ == auVar24._4_4_ && auVar24._0_4_ < auVar27._0_4_ ||
                      auVar24._4_4_ < auVar27._4_4_) & 1)) {
            pdVar9[uVar19] = 1.0;
          }
          if ((auVar27._12_4_ != auVar24._12_4_ || auVar27._8_4_ <= auVar24._8_4_) &&
              auVar27._12_4_ <= auVar24._12_4_) {
            pdVar9[uVar19 + 1] = 1.0;
          }
          uVar19 = uVar19 + 2;
        } while ((sVar8 + 1 & 0xfffffffffffffffe) != uVar19);
      }
      auVar11 = _DAT_003c57d0;
      auVar10 = _DAT_003c57c0;
      sVar8 = (this->rowscale_)._M_size;
      if (sVar8 != 0) {
        lVar18 = sVar8 - 1;
        auVar25._8_4_ = (int)lVar18;
        auVar25._0_8_ = lVar18;
        auVar25._12_4_ = (int)((ulong)lVar18 >> 0x20);
        uVar19 = 0;
        auVar25 = auVar25 ^ _DAT_003c57d0;
        do {
          auVar28._8_4_ = (int)uVar19;
          auVar28._0_8_ = uVar19;
          auVar28._12_4_ = (int)(uVar19 >> 0x20);
          auVar24 = (auVar28 | auVar10) ^ auVar11;
          if ((bool)(~(auVar24._4_4_ == auVar25._4_4_ && auVar25._0_4_ < auVar24._0_4_ ||
                      auVar25._4_4_ < auVar24._4_4_) & 1)) {
            pdVar14[uVar19] = 1.0;
          }
          if ((auVar24._12_4_ != auVar25._12_4_ || auVar24._8_4_ <= auVar25._8_4_) &&
              auVar24._12_4_ <= auVar25._12_4_) {
            pdVar14[uVar19 + 1] = 1.0;
          }
          uVar19 = uVar19 + 2;
        } while ((sVar8 + 1 & 0xfffffffffffffffe) != uVar19);
      }
      __s = operator_new(sVar16 << 3);
      local_48 = 0;
      memset(__s,0,sVar16 << 3);
      uVar19 = uVar21 * 8;
      __s_00 = operator_new(uVar19);
      lVar18 = 0;
      local_40 = uVar19;
      memset(__s_00,0,uVar19);
      local_38 = uVar21 & 0xffffffff;
      while( true ) {
        if ((int)uVar21 != 0) {
          lVar18 = 0;
          memset(__s_00,0,local_40);
        }
        if (0 < (int)uVar12) {
          uVar19 = 0;
          do {
            *(undefined8 *)((long)__s + uVar19 * 8) = 0;
            lVar17 = (long)piVar4[uVar19];
            iVar2 = piVar4[uVar19 + 1];
            if (piVar4[uVar19] < iVar2) {
              dVar23 = *(double *)((long)__s + uVar19 * 8);
              do {
                lVar18 = (long)piVar6[lVar17];
                dVar26 = ABS(pdVar7[lVar17]);
                dVar1 = dVar26;
                if (dVar26 <= dVar23) {
                  dVar1 = dVar23;
                }
                dVar23 = dVar1;
                *(double *)((long)__s + uVar19 * 8) = dVar23;
                dVar1 = *(double *)((long)__s_00 + lVar18 * 8);
                if (dVar26 <= dVar1) {
                  dVar26 = dVar1;
                }
                *(double *)((long)__s_00 + lVar18 * 8) = dVar26;
                lVar17 = lVar17 + 1;
              } while (iVar2 != lVar17);
            }
            uVar19 = uVar19 + 1;
          } while (uVar19 != uVar15);
        }
        if ((int)uVar21 < 1) {
          bVar20 = false;
        }
        else {
          uVar21 = 0;
          bVar20 = false;
          do {
            frexp(*(double *)((long)__s_00 + uVar21 * 8),&local_58);
            dVar23 = EquilibrationFactor(local_58,(int)lVar18,exp_00);
            *(double *)((long)__s_00 + uVar21 * 8) = dVar23;
            if ((dVar23 != 1.0) || (NAN(dVar23))) {
              pdVar14 = (this->rowscale_)._M_data;
              pdVar14[uVar21] = dVar23 * pdVar14[uVar21];
              bVar20 = true;
            }
            uVar21 = uVar21 + 1;
          } while (local_38 != uVar21);
        }
        if (0 < (int)uVar12) {
          uVar21 = 0;
          do {
            frexp(*(double *)((long)__s + uVar21 * 8),&local_5c);
            dVar23 = EquilibrationFactor(local_5c,(int)lVar18,exp_01);
            *(double *)((long)__s + uVar21 * 8) = dVar23;
            if ((dVar23 != 1.0) || (NAN(dVar23))) {
              pdVar14 = (this->colscale_)._M_data;
              pdVar14[uVar21] = dVar23 * pdVar14[uVar21];
              bVar20 = true;
            }
            uVar21 = uVar21 + 1;
          } while (uVar15 != uVar21);
        }
        if (!bVar20) break;
        if (0 < (int)uVar12) {
          uVar21 = 0;
          do {
            lVar17 = (long)piVar4[uVar21];
            iVar2 = piVar4[uVar21 + 1];
            if (piVar4[uVar21] < iVar2) {
              do {
                dVar23 = *(double *)((long)__s + uVar21 * 8) * pdVar7[lVar17];
                pdVar7[lVar17] = dVar23;
                lVar18 = (long)piVar6[lVar17];
                pdVar7[lVar17] = dVar23 * *(double *)((long)__s_00 + lVar18 * 8);
                lVar17 = lVar17 + 1;
              } while (iVar2 != lVar17);
            }
            uVar21 = uVar21 + 1;
          } while (uVar21 != uVar15);
        }
        if ((!bVar20) ||
           (uVar13 = (int)local_48 + 1, local_48 = (ulong)uVar13, uVar21 = local_50, uVar13 == 10))
        break;
      }
      operator_delete(__s_00);
      operator_delete(__s);
      return;
    }
  }
  return;
}

Assistant:

void Model::EquilibrateMatrix() {
    const Int m = A_.rows();
    const Int n = A_.cols();
    const Int* Ap = A_.colptr();
    const Int* Ai = A_.rowidx();
    double* Ax = A_.values();

    colscale_.resize(0);
    rowscale_.resize(0);

    // The absolute value of each nonzero entry of AI can be written as x*2^exp
    // with x in the range [0.5,1). We consider AI well scaled if each entry is
    // such that expmin <= exp <= expmax for parameters expmin and expmax.
    // For example,
    //
    //  expmin  expmax  allowed range
    //  -----------------------------
    //       0       2    [0.5,    4)
    //      -1       3    [0.25,   8)
    //       1       7    [1.0,  128)
    //
    // If AI is not well scaled, a recursive row and column equilibration is
    // applied. In each iteration, the scaling factors are roughly 1/sqrt(max),
    // where max is the maximum row or column entry. However, the factors are
    // truncated to powers of 2, so that no round-off errors occur.

    constexpr int expmin = 0;
    constexpr int expmax = 3;
    constexpr Int maxround = 10;

    // Quick return if entries are within the target range.
    bool out_of_range = false;
    for (Int p = 0; p < Ap[n]; p++) {
        int exp;
        std::frexp(std::abs(Ax[p]), &exp);
        if (exp < expmin || exp > expmax) {
            out_of_range = true;
            break;
        }
    }
    if (!out_of_range)
        return;

    colscale_.resize(n);
    rowscale_.resize(m);
    colscale_ = 1.0;
    rowscale_ = 1.0;
    Vector colmax(n), rowmax(m);

    for (Int round = 0; round < maxround; round++) {
        // Compute infinity norm of each row and column.
        rowmax = 0.0;
        for (Int j = 0; j < n; j++) {
            colmax[j] = 0.0;
            for (Int p = Ap[j]; p < Ap[j+1]; p++) {
                Int i = Ai[p];
                double xa = std::abs(Ax[p]);
                colmax[j] = std::max(colmax[j], xa);
                rowmax[i] = std::max(rowmax[i], xa);
            }
        }
        // Replace rowmax and colmax entries by scaling factors from this round.
        bool out_of_range = false;
        for (Int i = 0; i < m; i++) {
            int exp;
            std::frexp(rowmax[i], &exp);
            rowmax[i] = EquilibrationFactor(expmin, expmax, exp);
            if (rowmax[i] != 1.0) {
                out_of_range = true;
                rowscale_[i] *= rowmax[i];
            }
        }
        for (Int j = 0; j < n; j++) {
            int exp;
            std::frexp(colmax[j], &exp);
            colmax[j] = EquilibrationFactor(expmin, expmax, exp);
            if (colmax[j] != 1.0) {
                out_of_range = true;
                colscale_[j] *= colmax[j];
            }
        }
        if (!out_of_range)
            break;
        // Rescale A.
        for (Int j = 0; j < n; j++) {
            for (Int p = Ap[j]; p < Ap[j+1]; p++) {
                Ax[p] *= colmax[j];     // column scaling
                Ax[p] *= rowmax[Ai[p]]; // row scaling
            }
        }
    }
}